

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpacceptor.cpp
# Opt level: O0

int __thiscall
TCPAcceptor::accept(TCPAcceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int sd_00;
  socklen_t local_2c;
  int sd;
  socklen_t len;
  sockaddr_in address;
  TCPAcceptor *this_local;
  
  if ((this->m_listening & 1U) == 0) {
    this_local = (TCPAcceptor *)0x0;
  }
  else {
    local_2c = 0x10;
    address.sin_zero = (uchar  [8])this;
    memset(&sd,0,0x10);
    sd_00 = ::accept(this->m_lsd,(sockaddr *)&sd,&local_2c);
    if (sd_00 < 0) {
      perror("accept() failed");
      this_local = (TCPAcceptor *)0x0;
    }
    else {
      this_local = (TCPAcceptor *)operator_new(0x30);
      TCPStream::TCPStream((TCPStream *)this_local,sd_00,(sockaddr_in *)&sd);
    }
  }
  return (int)this_local;
}

Assistant:

TCPStream* TCPAcceptor::accept()
{
    if (!m_listening) {
        return nullptr;
    }

    struct sockaddr_in address;
    socklen_t len = sizeof(address);
    memset(&address, 0, sizeof(address));
    int sd = ::accept(m_lsd, (struct sockaddr*)&address, &len);
    if (sd < 0) {
        perror("accept() failed");
        return nullptr;
    }
    return new TCPStream(sd, &address);
}